

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.hpp
# Opt level: O2

optional_ptr<duckdb::TableCatalogEntry,_true>
duckdb::Catalog::GetEntry<duckdb::TableCatalogEntry>
          (ClientContext *context,string *catalog_name,string *schema_name,string *name,
          OnEntryNotFound if_not_found,QueryErrorContext error_context)

{
  CatalogEntry *pCVar1;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar2;
  CatalogException *this;
  allocator local_a1;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  EntryLookupInfo lookup_info;
  
  EntryLookupInfo::EntryLookupInfo(&lookup_info,TABLE_ENTRY,name,error_context);
  entry = GetEntry(context,catalog_name,schema_name,&lookup_info,if_not_found);
  if (entry.ptr == (CatalogEntry *)0x0) {
    oVar2.ptr = (TableCatalogEntry *)0x0;
  }
  else {
    pCVar1 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    if (pCVar1->type != TABLE_ENTRY) {
      this = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_70,"%s is not an %s",&local_a1);
      ::std::__cxx11::string::string((string *)&local_90,(string *)name);
      CatalogException::CatalogException<std::__cxx11::string,char_const*>
                (this,error_context,&local_70,&local_90,"table");
      __cxa_throw(this,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    oVar2.ptr = (TableCatalogEntry *)optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
  }
  return (optional_ptr<duckdb::TableCatalogEntry,_true>)oVar2.ptr;
}

Assistant:

static optional_ptr<T> GetEntry(ClientContext &context, const string &catalog_name, const string &schema_name,
	                                const string &name, OnEntryNotFound if_not_found,
	                                QueryErrorContext error_context = QueryErrorContext()) {
		EntryLookupInfo lookup_info(T::Type, name, error_context);
		auto entry = GetEntry(context, catalog_name, schema_name, lookup_info, if_not_found);
		if (!entry) {
			return nullptr;
		}
		if (entry->type != T::Type) {
			throw CatalogException(error_context, "%s is not an %s", name, T::Name);
		}
		return &entry->template Cast<T>();
	}